

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

bool chaiscript::eval::
     AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
     get_scoped_bool_condition
               (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node
               ,Dispatch_State *t_ss)

{
  bool bVar1;
  undefined1 auStack_28 [16];
  
  chaiscript::detail::Dispatch_Engine::new_scope((t_ss->m_stack_holder)._M_data);
  eval((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)auStack_28,
       (Dispatch_State *)node);
  bVar1 = AST_Node::get_bool_condition((Boxed_Value *)auStack_28,t_ss);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_28._8_8_);
  }
  chaiscript::detail::Dispatch_Engine::pop_scope((t_ss->m_stack_holder)._M_data);
  return bVar1;
}

Assistant:

static bool get_scoped_bool_condition(const AST_Node_Impl<T> &node, const chaiscript::detail::Dispatch_State &t_ss) {
        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
        return get_bool_condition(node.eval(t_ss), t_ss);
      }